

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignumlib.cpp
# Opt level: O2

void CVmObjBigNum::shift_right(char *ext,uint shift)

{
  ushort uVar1;
  ulong uVar2;
  byte bVar3;
  int iVar4;
  ulong i;
  
  uVar1 = *(ushort *)ext;
  if ((shift & 1) == 0) {
    for (uVar2 = (ulong)(uVar1 + 1 >> 1); shift >> 1 < uVar2; uVar2 = uVar2 - 1) {
      ext[uVar2 + 4] = ext[uVar2 + (4 - (ulong)(shift >> 1))];
    }
    while (uVar2 != 0) {
      ext[uVar2 + 4] = '\0';
      uVar2 = uVar2 - 1;
    }
  }
  else {
    bVar3 = (char)uVar1 * '\x04';
    iVar4 = (~shift + (uint)uVar1) * 4;
    uVar2 = (ulong)uVar1;
    while( true ) {
      bVar3 = bVar3 - 4;
      i = uVar2 - 1;
      if (uVar2 <= shift) break;
      set_dig(ext,i,(uint)(int)ext[(i - shift >> 1) + 5] >> (~(byte)iVar4 & 4) & 0xf);
      iVar4 = iVar4 + -4;
      uVar2 = i;
    }
    for (; i != 0xffffffffffffffff; i = i - 1) {
      ext[(i >> 1) + 5] = ext[(i >> 1) + 5] & '\x0f' << (bVar3 & 4);
      bVar3 = bVar3 - 4;
    }
  }
  return;
}

Assistant:

void CVmObjBigNum::shift_right(char *ext, unsigned int shift)
{
    size_t prec = get_prec(ext);
    size_t i;

    /* if it's an even shift, it's especially easy */
    if ((shift & 1) == 0)
    {
        /* simply move the bytes left by the required amount */
        for (i = (prec+1)/2 ; i > shift/2 ; --i)
            ext[VMBN_MANT + i-1] = ext[VMBN_MANT + i-1 - shift/2];

        /* zero the leading digits */
        for ( ; i > 0 ; --i)
            ext[VMBN_MANT + i-1] = 0;
    }
    else
    {
        /* apply the shift to each digit */
        for (i = prec ; i > shift  ; --i)
        {
            unsigned int dig;

            /* get this source digit */
            dig = get_dig(ext, i-1 - shift);

            /* set this destination digit */
            set_dig(ext, i-1, dig);
        }

        /* zero the remaining digits */
        for ( ; i >0 ; --i)
            set_dig(ext, i-1, 0);
    }
}